

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

void dgrminer::save_pattern_anomaly
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list,
               set<int,_std::less<int>,_std::allocator<int>_> *graph_ids,
               results_crate_anomalies *results_anomaly,bool set_of_graphs,PartialUnion *pu,
               int anomaly_id_of_explanation_pattern,double anomaly_outlierness,bool verbose)

{
  allocator<int> *this;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  reference piVar6;
  iterator iVar7;
  iterator iVar8;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> __result;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  undefined1 local_188 [8];
  vector<int,_std::allocator<int>_> new_;
  undefined1 local_158 [8];
  vector<int,_std::allocator<int>_> occurrences_vector;
  int local_12c;
  _Self local_128;
  _Self local_120;
  iterator it;
  set<int,_std::less<int>,_std::allocator<int>_> occurrences_set;
  array<int,_6UL> result_edge;
  array<int,_4UL> result_node_1;
  undefined1 local_b0 [8];
  array<int,_4UL> result_node;
  ulong local_80;
  size_t i;
  set<int,_std::less<int>,_std::allocator<int>_> already_saved_node_ids;
  double dStack_40;
  bool verbose_local;
  double anomaly_outlierness_local;
  PartialUnion *pPStack_30;
  int anomaly_id_of_explanation_pattern_local;
  PartialUnion *pu_local;
  results_crate_anomalies *prStack_20;
  bool set_of_graphs_local;
  results_crate_anomalies *results_anomaly_local;
  set<int,_std::less<int>,_std::allocator<int>_> *graph_ids_local;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list_local;
  
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = verbose;
  results_anomaly->anomaly_saved_instances = results_anomaly->anomaly_saved_instances + 1;
  dStack_40 = anomaly_outlierness;
  anomaly_outlierness_local._4_4_ = anomaly_id_of_explanation_pattern;
  pPStack_30 = pu;
  pu_local._7_1_ = set_of_graphs;
  prStack_20 = results_anomaly;
  results_anomaly_local = (results_crate_anomalies *)graph_ids;
  graph_ids_local = (set<int,_std::less<int>,_std::allocator<int>_> *)edge_list;
  debug_println<char[17],int,char[16],double>
            (verbose,(char (*) [17])"ANOMALY PATTERN ",&results_anomaly->anomaly_saved_instances,
             (char (*) [16])", OUTLIERNESS: ",&stack0xffffffffffffffc0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&i);
  local_80 = 0;
  while( true ) {
    sVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       graph_ids_local);
    if (sVar2 <= local_80) break;
    pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_80);
    pvVar4 = std::array<int,_10UL>::operator[](pvVar3,0);
    sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&i,pvVar4);
    if (sVar5 == 0) {
      pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_80);
      pvVar4 = std::array<int,_10UL>::operator[](pvVar3,0);
      pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&i,pvVar4);
      result_node._M_elems._8_8_ = pVar9.first._M_node;
      local_b0._0_4_ = prStack_20->anomaly_saved_instances;
      pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_80);
      pvVar4 = std::array<int,_10UL>::operator[](pvVar3,0);
      local_b0._4_4_ = *pvVar4;
      pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_80);
      pvVar4 = std::array<int,_10UL>::operator[](pvVar3,2);
      result_node._M_elems[0] = *pvVar4;
      pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_80);
      pvVar4 = std::array<int,_10UL>::operator[](pvVar3,3);
      result_node._M_elems[1] = *pvVar4;
      std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                (&prStack_20->anomaly_result_nodes,(value_type *)local_b0);
    }
    pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_80);
    pvVar4 = std::array<int,_10UL>::operator[](pvVar3,1);
    sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&i,pvVar4);
    if (sVar5 == 0) {
      pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_80);
      pvVar4 = std::array<int,_10UL>::operator[](pvVar3,1);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&i,pvVar4);
      result_edge._M_elems[4] = prStack_20->anomaly_saved_instances;
      pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_80);
      pvVar4 = std::array<int,_10UL>::operator[](pvVar3,1);
      result_edge._M_elems[5] = *pvVar4;
      pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_80);
      std::array<int,_10UL>::operator[](pvVar3,7);
      pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_80);
      std::array<int,_10UL>::operator[](pvVar3,8);
      std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                (&prStack_20->anomaly_result_nodes,(value_type *)(result_edge._M_elems + 4));
    }
    occurrences_set._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         prStack_20->anomaly_saved_instances;
    pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_80);
    pvVar4 = std::array<int,_10UL>::operator[](pvVar3,0);
    occurrences_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = *pvVar4;
    pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_80);
    pvVar4 = std::array<int,_10UL>::operator[](pvVar3,1);
    result_edge._M_elems[0] = *pvVar4;
    pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_80);
    pvVar4 = std::array<int,_10UL>::operator[](pvVar3,5);
    result_edge._M_elems[1] = *pvVar4;
    pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_80);
    pvVar4 = std::array<int,_10UL>::operator[](pvVar3,4);
    result_edge._M_elems[2] = *pvVar4;
    pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_80);
    pvVar4 = std::array<int,_10UL>::operator[](pvVar3,6);
    result_edge._M_elems[3] = *pvVar4;
    std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::push_back
              (&prStack_20->anomaly_result_edges,
               (value_type *)&occurrences_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_80 = local_80 + 1;
  }
  std::vector<int,_std::allocator<int>_>::push_back
            (&prStack_20->anomaly_id_of_anomalous_pattern,&prStack_20->anomaly_saved_instances);
  std::vector<int,_std::allocator<int>_>::push_back
            (&prStack_20->anomaly_id_of_explanation_pattern,
             (value_type_conflict *)((long)&anomaly_outlierness_local + 4));
  std::vector<double,_std::allocator<double>_>::push_back
            (&prStack_20->anomaly_outlierness,&stack0xffffffffffffffc0);
  if ((pu_local._7_1_ & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_188);
    iVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)results_anomaly_local);
    iVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)results_anomaly_local);
    __result = std::back_inserter<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)local_188);
    std::
    copy<std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
              ((_Rb_tree_const_iterator<int>)iVar7._M_node,
               (_Rb_tree_const_iterator<int>)iVar8._M_node,__result);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&prStack_20->anomaly_occurrences,(value_type *)local_188);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_188);
  }
  else {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&it);
    local_120._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)results_anomaly_local);
    while( true ) {
      local_128._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)results_anomaly_local);
      bVar1 = std::operator!=(&local_120,&local_128);
      if (!bVar1) break;
      piVar6 = std::_Rb_tree_const_iterator<int>::operator*(&local_120);
      local_12c = PartialUnion::queryMappingSnapshotsToGraphs(pu,*piVar6);
      pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&it,&local_12c);
      occurrences_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pVar9.first._M_node;
      std::_Rb_tree_const_iterator<int>::operator++(&local_120);
    }
    iVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&it);
    iVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&it);
    this = (allocator<int> *)
           ((long)&new_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(this);
    std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)local_158,
               (_Rb_tree_const_iterator<int>)iVar7._M_node,
               (_Rb_tree_const_iterator<int>)iVar8._M_node,this);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&new_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&prStack_20->anomaly_occurrences,(value_type *)local_158);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_158);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&it);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&i);
  return;
}

Assistant:

void save_pattern_anomaly(std::vector<std::array<int, PAT___SIZE>> &edge_list, std::set<int> &graph_ids,
                              results_crate_anomalies * results_anomaly, bool set_of_graphs, PartialUnion pu,
                              int anomaly_id_of_explanation_pattern, double anomaly_outlierness,
                              bool verbose = false)
	{
		results_anomaly->anomaly_saved_instances++;

        debug_println(verbose, "ANOMALY PATTERN ", results_anomaly->anomaly_saved_instances, ", OUTLIERNESS: ",
                      anomaly_outlierness);

		//anomaly_result_edges, anomaly_result_nodes
		std::set<int> already_saved_node_ids;
		for (size_t i = 0; i < edge_list.size(); i++)
		{
			if (already_saved_node_ids.count(edge_list[i][0]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][0]);
				std::array<int, 4> result_node = { results_anomaly->anomaly_saved_instances, edge_list[i][0], edge_list[i][2], edge_list[i][3] };
				results_anomaly->anomaly_result_nodes.push_back(result_node);
			}
			if (already_saved_node_ids.count(edge_list[i][1]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][1]);
				std::array<int, 4> result_node = { results_anomaly->anomaly_saved_instances, edge_list[i][1], edge_list[i][7], edge_list[i][8] };
				results_anomaly->anomaly_result_nodes.push_back(result_node);
			}

			std::array<int, 6> result_edge = { results_anomaly->anomaly_saved_instances, edge_list[i][0], edge_list[i][1], edge_list[i][5], edge_list[i][4], edge_list[i][6] };
			results_anomaly->anomaly_result_edges.push_back(result_edge);
		}


		//anomaly_id_of_anomalous_pattern
		results_anomaly->anomaly_id_of_anomalous_pattern.push_back(results_anomaly->anomaly_saved_instances);

		//anomaly_id_of_explanation_pattern
		results_anomaly->anomaly_id_of_explanation_pattern.push_back(anomaly_id_of_explanation_pattern);

		//anomaly_outlierness
		results_anomaly->anomaly_outlierness.push_back(anomaly_outlierness);

		//anomaly_occurrences
		if (set_of_graphs)
		{
			std::set<int> occurrences_set;
			for (std::set<int>::iterator it = graph_ids.begin(); it != graph_ids.end(); ++it)
				//for (int j = 0; j < graph_ids.size(); j++)
			{
				occurrences_set.insert(pu.queryMappingSnapshotsToGraphs(*it));
			}
			std::vector<int> occurrences_vector(occurrences_set.begin(), occurrences_set.end());
			results_anomaly->anomaly_occurrences.push_back(occurrences_vector);
		}
		else
		{
			std::vector<int> new_;
			std::copy(graph_ids.begin(), graph_ids.end(), std::back_inserter(new_));
			results_anomaly->anomaly_occurrences.push_back(new_);
		}

	}